

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyLTY.hpp
# Opt level: O3

void njoy::ENDFtk::section::DerivedRatioToStandard::verifyLTY(int LTY)

{
  undefined8 *puVar1;
  
  if (0xfffffffc < LTY - 4U) {
    return;
  }
  tools::Log::error<char_const*>("Encountered illegal LTY value");
  tools::Log::info<char_const*>("LTY must be 1,2,3 for DerivedRatioToStandard");
  tools::Log::info<char_const*,int>("LTY value: {}",LTY);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyLTY( int LTY ) {

  if ( LTY < 1 || LTY > 3 ) {

      Log::error( "Encountered illegal LTY value" );
      Log::info( "LTY must be 1,2,3 for DerivedRatioToStandard" );
      Log::info( "LTY value: {}", LTY );
      throw std::exception();
  }
}